

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

bool __thiscall
helics::BaseTimeCoordinator::addDependency(BaseTimeCoordinator *this,GlobalFederateId fedID)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  long in_RDI;
  TimeDependencies *unaff_retaddr;
  GlobalFederateId in_stack_0000000c;
  DependencyInfo *dep;
  GlobalFederateId in_stack_00000020;
  GlobalFederateId local_8;
  bool local_1;
  
  bVar1 = TimeDependencies::addDependency((TimeDependencies *)dep,in_stack_00000020);
  if (bVar1) {
    bVar1 = GlobalFederateId::operator==(&local_8,(GlobalFederateId)*(BaseType *)(in_RDI + 0x48));
    if ((bVar1) &&
       (pDVar2 = TimeDependencies::getDependencyInfo(unaff_retaddr,in_stack_0000000c),
       pDVar2 != (DependencyInfo *)0x0)) {
      pDVar2->connection = SELF;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BaseTimeCoordinator::addDependency(GlobalFederateId fedID)
{
    if (dependencies.addDependency(fedID)) {
        if (fedID == mSourceId) {
            auto* dep = dependencies.getDependencyInfo(fedID);
            if (dep != nullptr) {
                dep->connection = ConnectionType::SELF;
            }
        }
        return true;
    }
    return false;
}